

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

XXH_errorcode ZSTD_XXH64_update(XXH64_state_t *state_in,void *input,size_t len)

{
  XXH_errorcode XVar1;
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [32];
  ulong uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  void *pvVar2;
  
  state_in->total_len = state_in->total_len + len;
  uVar5 = (ulong)state_in->memsize;
  if (uVar5 + len < 0x20) {
    pvVar2 = memcpy((void *)((long)state_in->mem64 + uVar5),input,len);
    XVar1 = (XXH_errorcode)pvVar2;
    uVar5 = (ulong)((int)len + state_in->memsize);
  }
  else {
    pauVar4 = (undefined1 (*) [32])(len + (long)input);
    if (uVar5 != 0) {
      memcpy((void *)((long)state_in->mem64 + uVar5),input,(ulong)(0x20 - state_in->memsize));
      auVar6 = *(undefined1 (*) [32])state_in->mem64;
      auVar8._8_8_ = 0xc2b2ae3d;
      auVar8._0_8_ = 0xc2b2ae3d;
      auVar8._16_8_ = 0xc2b2ae3d;
      auVar8._24_8_ = 0xc2b2ae3d;
      auVar8 = vpmuludq_avx2(auVar6,auVar8);
      auVar10 = vpsrlq_avx2(auVar6,0x20);
      auVar12._8_8_ = 0xc2b2ae3d27d4eb4f;
      auVar12._0_8_ = 0xc2b2ae3d27d4eb4f;
      auVar12._16_8_ = 0xc2b2ae3d27d4eb4f;
      auVar12._24_8_ = 0xc2b2ae3d27d4eb4f;
      auVar10 = vpmuludq_avx2(auVar10,auVar12);
      auVar8 = vpaddq_avx2(auVar8,auVar10);
      auVar8 = vpsllq_avx2(auVar8,0x20);
      auVar6 = vpmuludq_avx2(auVar6,auVar12);
      auVar8 = vpaddq_avx2(auVar6,auVar8);
      auVar6._0_8_ = state_in->v1;
      auVar6._8_8_ = state_in->v2;
      auVar6._16_8_ = state_in->v3;
      auVar6._24_8_ = state_in->v4;
      auVar6 = vpaddq_avx2(auVar8,auVar6);
      auVar8 = vpsrlq_avx2(auVar6,0x21);
      auVar6 = vpsllq_avx2(auVar6,0x1f);
      auVar10 = vpor_avx2(auVar6,auVar8);
      auVar15._8_8_ = 0x9e3779b1;
      auVar15._0_8_ = 0x9e3779b1;
      auVar15._16_8_ = 0x9e3779b1;
      auVar15._24_8_ = 0x9e3779b1;
      auVar6 = vpmuludq_avx2(auVar10,auVar15);
      auVar8 = vpsrlq_avx2(auVar10,0x20);
      auVar13._8_8_ = 0x9e3779b185ebca87;
      auVar13._0_8_ = 0x9e3779b185ebca87;
      auVar13._16_8_ = 0x9e3779b185ebca87;
      auVar13._24_8_ = 0x9e3779b185ebca87;
      auVar8 = vpmuludq_avx2(auVar8,auVar13);
      auVar6 = vpaddq_avx2(auVar6,auVar8);
      auVar8 = vpsllq_avx2(auVar6,0x20);
      auVar6 = vpmuludq_avx2(auVar10,auVar13);
      auVar6 = vpaddq_avx2(auVar6,auVar8);
      state_in->v1 = auVar6._0_8_;
      state_in->v2 = auVar6._8_8_;
      state_in->v3 = auVar6._16_8_;
      state_in->v4 = auVar6._24_8_;
      input = (void *)((long)input + (ulong)(0x20 - state_in->memsize));
      state_in->memsize = 0;
    }
    pauVar3 = (undefined1 (*) [32])((long)input + 0x20);
    if (pauVar3 <= pauVar4) {
      pauVar3 = pauVar4 + -1;
      auVar10._0_8_ = state_in->v1;
      auVar10._8_8_ = state_in->v2;
      auVar10._16_8_ = state_in->v3;
      auVar10._24_8_ = state_in->v4;
      auVar7._8_8_ = 0xc2b2ae3d;
      auVar7._0_8_ = 0xc2b2ae3d;
      auVar7._16_8_ = 0xc2b2ae3d;
      auVar7._24_8_ = 0xc2b2ae3d;
      auVar9._8_8_ = 0xc2b2ae3d27d4eb4f;
      auVar9._0_8_ = 0xc2b2ae3d27d4eb4f;
      auVar9._16_8_ = 0xc2b2ae3d27d4eb4f;
      auVar9._24_8_ = 0xc2b2ae3d27d4eb4f;
      auVar11._8_8_ = 0x9e3779b1;
      auVar11._0_8_ = 0x9e3779b1;
      auVar11._16_8_ = 0x9e3779b1;
      auVar11._24_8_ = 0x9e3779b1;
      auVar14._8_8_ = 0x9e3779b185ebca87;
      auVar14._0_8_ = 0x9e3779b185ebca87;
      auVar14._16_8_ = 0x9e3779b185ebca87;
      auVar14._24_8_ = 0x9e3779b185ebca87;
      do {
        auVar6 = *input;
        auVar8 = vpmuludq_avx2(auVar6,auVar7);
        auVar15 = vpsrlq_avx2(auVar6,0x20);
        auVar15 = vpmuludq_avx2(auVar15,auVar9);
        auVar8 = vpaddq_avx2(auVar8,auVar15);
        auVar8 = vpsllq_avx2(auVar8,0x20);
        auVar6 = vpmuludq_avx2(auVar6,auVar9);
        auVar6 = vpaddq_avx2(auVar6,auVar10);
        auVar6 = vpaddq_avx2(auVar6,auVar8);
        auVar8 = vpsrlq_avx2(auVar6,0x21);
        auVar6 = vpsllq_avx2(auVar6,0x1f);
        auVar10 = vpor_avx2(auVar6,auVar8);
        auVar6 = vpmuludq_avx2(auVar10,auVar11);
        auVar8 = vpsrlq_avx2(auVar10,0x20);
        auVar8 = vpmuludq_avx2(auVar8,auVar14);
        auVar6 = vpaddq_avx2(auVar6,auVar8);
        auVar8 = vpsllq_avx2(auVar6,0x20);
        auVar6 = vpmuludq_avx2(auVar10,auVar14);
        auVar10 = vpaddq_avx2(auVar6,auVar8);
        input = (void *)((long)input + 0x20);
      } while (input <= pauVar3);
      state_in->v1 = auVar10._0_8_;
      state_in->v2 = auVar10._8_8_;
      state_in->v3 = auVar10._16_8_;
      state_in->v4 = auVar10._24_8_;
    }
    if (pauVar4 <= input) {
      return (XXH_errorcode)pauVar3;
    }
    uVar5 = (long)pauVar4 - (long)input;
    pvVar2 = memcpy(state_in->mem64,input,uVar5);
    XVar1 = (XXH_errorcode)pvVar2;
  }
  state_in->memsize = (uint)uVar5;
  return XVar1;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH64_update (XXH64_state_t* state_in, const void* input, size_t len)
{
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH64_update_endian(state_in, input, len, XXH_littleEndian);
    else
        return XXH64_update_endian(state_in, input, len, XXH_bigEndian);
}